

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

void nn_hash_rehash(nn_hash *self)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  uint32_t uVar4;
  void *pvVar5;
  nn_list_item *pnVar6;
  uint *in_RDI;
  uint32_t newslot;
  nn_hash_item *hitm;
  nn_list *oldarray;
  uint32_t oldslots;
  uint32_t i;
  nn_list_item *in_stack_ffffffffffffffb8;
  nn_list *in_stack_ffffffffffffffc0;
  nn_list *pnVar7;
  nn_list *self_00;
  uint local_c;
  
  uVar1 = *in_RDI;
  lVar2 = *(long *)(in_RDI + 2);
  *in_RDI = *in_RDI << 1;
  pvVar5 = nn_alloc_(0x2fefff);
  *(void **)(in_RDI + 2) = pvVar5;
  if (*(long *)(in_RDI + 2) != 0) {
    for (local_c = 0; local_c != *in_RDI; local_c = local_c + 1) {
      nn_list_init((nn_list *)(*(long *)(in_RDI + 2) + (ulong)local_c * 0x10));
    }
    for (local_c = 0; local_c != uVar1; local_c = local_c + 1) {
      while (iVar3 = nn_list_empty((nn_list *)(lVar2 + (ulong)local_c * 0x10)), iVar3 == 0) {
        pnVar6 = nn_list_begin((nn_list *)(lVar2 + (ulong)local_c * 0x10));
        if (pnVar6 == (nn_list_item *)0x0) {
          pnVar7 = (nn_list *)0x0;
        }
        else {
          pnVar6 = nn_list_begin((nn_list *)(lVar2 + (ulong)local_c * 0x10));
          pnVar7 = (nn_list *)&pnVar6[-1].prev;
        }
        self_00 = pnVar7;
        nn_list_erase(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
        uVar4 = nn_hash_key(*(uint32_t *)&pnVar7->first);
        in_stack_ffffffffffffffc0 =
             (nn_list *)(*(long *)(in_RDI + 2) + (ulong)(uVar4 % *in_RDI) * 0x10);
        pnVar6 = (nn_list_item *)&pnVar7->last;
        nn_list_end((nn_list *)(*(long *)(in_RDI + 2) + (ulong)(uVar4 % *in_RDI) * 0x10));
        nn_list_insert(self_00,pnVar6,(nn_list_item *)in_stack_ffffffffffffffc0);
      }
      nn_list_term((nn_list *)0x2ff1d0);
    }
    nn_free((void *)0x2ff1ea);
    return;
  }
  nn_backtrace_print();
  fprintf(_stderr,"Out of memory (%s:%d)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/utils/hash.c"
          ,0x43);
  fflush(_stderr);
  nn_err_abort();
}

Assistant:

static void nn_hash_rehash (struct nn_hash *self) {
    uint32_t i;
    uint32_t oldslots;
    struct nn_list *oldarray;
    struct nn_hash_item *hitm;
    uint32_t newslot;

    /*  Allocate new double-sized array of slots. */
    oldslots = self->slots;
    oldarray = self->array;
    self->slots *= 2;
    self->array = nn_alloc (sizeof (struct nn_list) * self->slots, "hash map");
    alloc_assert (self->array);
    for (i = 0; i != self->slots; ++i)
    nn_list_init (&self->array [i]);

    /*  Move the items from old slot array to new slot array. */
    for (i = 0; i != oldslots; ++i) {
    while (!nn_list_empty (&oldarray [i])) {
        hitm = nn_cont (nn_list_begin (&oldarray [i]),
                struct nn_hash_item, list);
        nn_list_erase (&oldarray [i], &hitm->list);
        newslot = nn_hash_key (hitm->key) % self->slots;
        nn_list_insert (&self->array [newslot], &hitm->list,
                nn_list_end (&self->array [newslot]));
    }

    nn_list_term (&oldarray [i]);
    }

    /*  Deallocate the old array of slots. */
    nn_free (oldarray);
}